

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImDrawList::~ImDrawList(ImDrawList *this)

{
  ImDrawChannel *ptr;
  ImVec2 *ptr_00;
  void **ptr_01;
  ImVec4 *ptr_02;
  ImDrawVert *ptr_03;
  unsigned_short *ptr_04;
  ImDrawCmd *ptr_05;
  
  _ClearFreeMemory(this);
  ImDrawListSplitter::ClearFreeMemory(&this->_Splitter);
  ptr = (this->_Splitter)._Channels.Data;
  if (ptr != (ImDrawChannel *)0x0) {
    ImGui::MemFree(ptr);
  }
  ptr_00 = (this->_Path).Data;
  if (ptr_00 != (ImVec2 *)0x0) {
    ImGui::MemFree(ptr_00);
  }
  ptr_01 = (this->_TextureIdStack).Data;
  if (ptr_01 != (void **)0x0) {
    ImGui::MemFree(ptr_01);
  }
  ptr_02 = (this->_ClipRectStack).Data;
  if (ptr_02 != (ImVec4 *)0x0) {
    ImGui::MemFree(ptr_02);
  }
  ptr_03 = (this->VtxBuffer).Data;
  if (ptr_03 != (ImDrawVert *)0x0) {
    ImGui::MemFree(ptr_03);
  }
  ptr_04 = (this->IdxBuffer).Data;
  if (ptr_04 != (unsigned_short *)0x0) {
    ImGui::MemFree(ptr_04);
  }
  ptr_05 = (this->CmdBuffer).Data;
  if (ptr_05 != (ImDrawCmd *)0x0) {
    ImGui::MemFree(ptr_05);
  }
  return;
}

Assistant:

~ImDrawList() { _ClearFreeMemory(); }